

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opbehavior.cc
# Opt level: O3

uintb __thiscall
OpBehaviorIntSext::recoverInputUnary(OpBehaviorIntSext *this,int4 sizeout,uintb out,int4 sizein)

{
  ulong uVar1;
  LowlevelError *pLVar2;
  int iVar3;
  string local_40;
  
  if (7 < sizein) {
    sizein = 8;
  }
  uVar1 = uintbmasks[sizein];
  if (((uVar1 >> 1 ^ uVar1) & out) == 0) {
    if ((uVar1 & out) != out) {
      pLVar2 = (LowlevelError *)__cxa_allocate_exception(0x20);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Output is not in range of sext operation","");
      LowlevelError::LowlevelError(pLVar2,&local_40);
      __cxa_throw(pLVar2,&EvaluationError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  else {
    iVar3 = 8;
    if (sizeout < 8) {
      iVar3 = sizeout;
    }
    if (((uintbmasks[iVar3] ^ uVar1) & ~out) != 0) {
      pLVar2 = (LowlevelError *)__cxa_allocate_exception(0x20);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Output is not in range of sext operation","");
      LowlevelError::LowlevelError(pLVar2,&local_40);
      __cxa_throw(pLVar2,&EvaluationError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  return uVar1 & out;
}

Assistant:

uintb OpBehaviorIntSdiv::evaluateBinary(int4 sizeout,int4 sizein,uintb in1,uintb in2) const

{
  if (in2 == 0)
    throw EvaluationError("Divide by 0");
  intb num = in1;		// Convert to signed
  intb denom = in2;
  sign_extend(num,8*sizein-1);
  sign_extend(denom,8*sizein-1);
  intb sres = num/denom;	// Do the signed division
  zero_extend(sres,8*sizeout-1); // Cut to appropriate size
  return (uintb)sres;		// Recast as unsigned
}